

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  char *pcVar2;
  char cVar3;
  SizeType SVar4;
  
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
  bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartObject(handler);
  if (bVar1) {
    SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>(this,is);
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    pcVar2 = is->current_;
    cVar3 = *pcVar2;
    if (cVar3 == '}') {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
      SVar4 = 0;
LAB_0017dcec:
      bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndObject(handler,SVar4);
      if (bVar1) {
        return;
      }
    }
    else {
      SVar4 = 0;
      do {
        if (cVar3 != '\"') {
          pcVar2 = pcVar2 + (is->count_ - (long)is->buffer_);
          *(undefined4 *)(this + 0x30) = 4;
          goto LAB_0017ddf3;
        }
        ParseString<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler,true);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>(this,is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if (*is->current_ != ':') {
          pcVar2 = is->current_ + (is->count_ - (long)is->buffer_);
          *(undefined4 *)(this + 0x30) = 5;
          goto LAB_0017ddf3;
        }
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>(this,is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        ParseValue<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>(this,is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        cVar3 = *is->current_;
        if (cVar3 != ',') {
          if (cVar3 != '}') {
            pcVar2 = is->current_ + (is->count_ - (long)is->buffer_);
            *(undefined4 *)(this + 0x30) = 6;
            goto LAB_0017ddf3;
          }
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
          SVar4 = SVar4 + 1;
          goto LAB_0017dcec;
        }
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>(this,is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pcVar2 = is->current_;
        cVar3 = *pcVar2;
        SVar4 = SVar4 + 1;
      } while (cVar3 != '}');
      bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndObject(handler,SVar4);
      if (bVar1) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        return;
      }
    }
  }
  pcVar2 = is->current_ + (is->count_ - (long)is->buffer_);
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_0017ddf3:
  *(char **)(this + 0x38) = pcVar2;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }